

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutExperimental.cpp
# Opt level: O1

void __thiscall LayoutExperimental::createElements(LayoutExperimental *this)

{
  lay_context *ctx;
  lay_id lVar1;
  lay_id lVar2;
  
  ctx = &(this->super_GUILayout).m_lctx;
  lay_set_contain(ctx,(this->super_GUILayout).m_root,2);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&(this->m_leftColumn).name,0,(this->m_leftColumn).name._M_string_length,"Left column",
             0xb);
  lVar1 = lay_item(ctx);
  lay_set_size_xy(ctx,lVar1,200,0);
  lay_set_behave(ctx,lVar1,0x140);
  lay_insert(ctx,(this->super_GUILayout).m_root,lVar1);
  (this->m_leftColumn).id = lVar1;
  GUILayout::registerNamedElement(&this->super_GUILayout,&this->m_leftColumn);
  lVar1 = lay_item(ctx);
  lay_set_behave(ctx,lVar1,0x1e0);
  lay_set_contain(ctx,lVar1,3);
  lay_insert(ctx,(this->super_GUILayout).m_root,lVar1);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&(this->m_right1).name,0,(this->m_right1).name._M_string_length,"Right 1",7);
  lVar2 = lay_item(ctx);
  lay_set_size_xy(ctx,lVar2,0,0xfa);
  lay_set_behave(ctx,lVar2,0xa0);
  lay_insert(ctx,lVar1,lVar2);
  (this->m_right1).id = lVar2;
  GUILayout::registerNamedElement(&this->super_GUILayout,&this->m_right1);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&(this->m_right2).name,0,(this->m_right2).name._M_string_length,"Right 2",7);
  lVar2 = lay_item(ctx);
  lay_set_behave(ctx,lVar2,0x1e0);
  lay_insert(ctx,lVar1,lVar2);
  (this->m_right2).id = lVar2;
  GUILayout::registerNamedElement(&this->super_GUILayout,&this->m_right2);
  return;
}

Assistant:

void LayoutExperimental::createElements()
{
    set_contain(m_root, LAY_ROW);

    {
        m_leftColumn.name = "Left column";
        auto id = item();
        set_size_xy(id, 200, 0);
        set_behave(id, LAY_VFILL);
        insert(m_root, id);
        m_leftColumn.id = id;
        registerNamedElement(m_leftColumn);
    }

    auto right = item();
    set_behave(right, LAY_HFILL | LAY_VFILL);
    set_contain(right, LAY_COLUMN);
    insert(m_root, right);

    {
        m_right1.name = "Right 1";
        auto id = item();
        set_size_xy(id, 0, 250);
        set_behave(id, LAY_HFILL);
        insert(right, id);
        m_right1.id = id;
        registerNamedElement(m_right1);
    }

    {
        m_right2.name = "Right 2";
        auto id = item();
        set_behave(id, LAY_HFILL | LAY_VFILL);
        insert(right, id);
        m_right2.id = id;
        registerNamedElement(m_right2);
    }
}